

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateSource
          (MessageGenerator *this,Printer *printer)

{
  string *args_1;
  void *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int32_t key;
  pointer puVar4;
  ExtensionRange *pEVar5;
  ExtensionRange *pEVar6;
  pointer puVar7;
  pointer puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  undefined1 auVar10 [16];
  pointer ppEVar11;
  bool include_default;
  bool bVar12;
  int iVar13;
  FieldGenerator *pFVar14;
  ulong uVar15;
  mapped_type *pmVar16;
  long *plVar17;
  Descriptor *pDVar18;
  char *pcVar19;
  ulong *puVar20;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  Descriptor *extraout_RDX_04;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator;
  pointer puVar21;
  pointer puVar22;
  pointer puVar23;
  pointer ppEVar24;
  Descriptor *descriptor;
  ulong uVar25;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator_2;
  long lVar26;
  ulong uVar27;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  long lVar28;
  pointer ppEVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  string suffix_added;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  string parent_class_ref;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  init_flags;
  TextFormatDecodeData text_format_decode_data;
  string field_description_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  void *local_188;
  FieldGeneratorMap *local_180;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  local_178;
  FieldDescriptor **local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  key_type local_120;
  int local_fc;
  undefined1 local_f8 [8];
  undefined1 local_f0 [24];
  _Base_ptr local_d8;
  size_t local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  TextFormatDecodeData local_90;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  long lVar32;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) == '\0') {
    args_1 = &this->class_name_;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"#pragma mark - $classname$\n\n",(char (*) [10])0x3e9312,args_1);
    if ((this->deprecated_attribute_)._M_string_length != 0) {
      io::Printer::Print<>
                (printer,
                 "#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n\n"
                );
    }
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"@implementation $classname$\n\n",(char (*) [10])0x3e9312,args_1);
    puVar4 = (this->oneof_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar21 = (this->oneof_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar4;
        puVar21 = puVar21 + 1) {
      OneofGenerator::GeneratePropertyImplementation
                ((puVar21->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                 ._M_head_impl,printer);
    }
    pDVar18 = this->descriptor_;
    if (0 < *(int *)(pDVar18 + 4)) {
      lVar28 = 0;
      lVar26 = 0;
      do {
        pFVar14 = FieldGeneratorMap::get
                            (&this->field_generators_,
                             (FieldDescriptor *)(*(long *)(pDVar18 + 0x28) + lVar28));
        (*pFVar14->_vptr_FieldGenerator[4])(pFVar14,printer);
        lVar26 = lVar26 + 1;
        pDVar18 = this->descriptor_;
        lVar28 = lVar28 + 0x48;
      } while (lVar26 < *(int *)(pDVar18 + 4));
    }
    local_158 = anon_unknown_7::SortFieldsByNumber(pDVar18);
    pDVar18 = this->descriptor_;
    iVar13 = *(int *)(pDVar18 + 4);
    uVar27 = (ulong)iVar13;
    uVar15 = uVar27 * 8;
    uVar25 = 0xffffffffffffffff;
    if (-1 < (long)uVar27) {
      uVar25 = uVar15;
    }
    local_188 = operator_new__(uVar25);
    auVar10 = _DAT_003dea10;
    if (0 < iVar13) {
      lVar28 = *(long *)(pDVar18 + 0x28);
      lVar26 = uVar27 - 1;
      auVar30._8_4_ = (int)lVar26;
      auVar30._0_8_ = lVar26;
      auVar30._12_4_ = (int)((ulong)lVar26 >> 0x20);
      lVar26 = 0;
      auVar30 = auVar30 ^ _DAT_003dea10;
      auVar31 = _DAT_003dea00;
      do {
        auVar33 = auVar31 ^ auVar10;
        if ((bool)(~(auVar33._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar33._0_4_ ||
                    auVar30._4_4_ < auVar33._4_4_) & 1)) {
          *(long *)((long)local_188 + lVar26) = lVar28;
        }
        if ((auVar33._12_4_ != auVar30._12_4_ || auVar33._8_4_ <= auVar30._8_4_) &&
            auVar33._12_4_ <= auVar30._12_4_) {
          *(long *)((long)local_188 + lVar26 + 8) = lVar28 + 0x48;
        }
        lVar32 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + 2;
        auVar31._8_8_ = lVar32 + 2;
        lVar26 = lVar26 + 0x10;
        lVar28 = lVar28 + 0x90;
      } while ((ulong)(iVar13 + 1U >> 1) << 4 != lVar26);
    }
    if (iVar13 != 0) {
      pvVar1 = (void *)((long)local_188 + uVar15);
      lVar26 = 0x3f;
      if (uVar27 != 0) {
        for (; uVar27 >> lVar26 == 0; lVar26 = lVar26 + -1) {
        }
      }
      std::
      __introsort_loop<google::protobuf::FieldDescriptor_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                (local_188,pvVar1,((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e);
      if (iVar13 < 0x11) {
        std::
        __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                  (local_188,pvVar1);
      }
      else {
        lVar26 = (long)local_188 + 0x80;
        std::
        __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                  (local_188,lVar26);
        lVar28 = uVar15 - 0x80;
        do {
          std::
          __unguarded_linear_insert<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                    (lVar26);
          lVar26 = lVar26 + 8;
          lVar28 = lVar28 + -8;
        } while (lVar28 != 0);
      }
    }
    local_178.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (ExtensionRange **)0x0;
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::reserve(&local_178,(long)*(int *)(this->descriptor_ + 0x78));
    pDVar18 = this->descriptor_;
    if (0 < *(int *)(pDVar18 + 0x78)) {
      lVar26 = 0;
      lVar28 = 0;
      do {
        local_f8 = (undefined1  [8])(*(long *)(pDVar18 + 0x48) + lVar26);
        if (local_178.
            super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_178.
            super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor::ExtensionRange_const*>
                    ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                      *)&local_178,
                     (iterator)
                     local_178.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(ExtensionRange **)local_f8);
        }
        else {
          *local_178.
           super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (ExtensionRange *)local_f8;
          local_178.
          super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_178.
               super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar28 = lVar28 + 1;
        pDVar18 = this->descriptor_;
        lVar26 = lVar26 + 0x10;
      } while (lVar28 < *(int *)(pDVar18 + 0x78));
    }
    ppEVar24 = local_178.
               super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar11 = local_178.
               super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_178.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_178.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar28 = (long)local_178.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_178.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = lVar28 >> 3;
      lVar26 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar26 == 0; lVar26 = lVar26 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                (local_178.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_178.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar28 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                  (ppEVar24,ppEVar11);
      }
      else {
        ppEVar29 = ppEVar24 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                  (ppEVar24,ppEVar29);
        for (; ppEVar29 != ppEVar11; ppEVar29 = ppEVar29 + 1) {
          pEVar5 = ppEVar29[-1];
          pEVar6 = *ppEVar29;
          iVar13 = pEVar6->start;
          iVar3 = pEVar5->start;
          ppEVar24 = ppEVar29;
          while (iVar13 < iVar3) {
            *ppEVar24 = pEVar5;
            pEVar5 = ppEVar24[-2];
            ppEVar24 = ppEVar24 + -1;
            iVar3 = pEVar5->start;
          }
          *ppEVar24 = pEVar6;
        }
      }
    }
    local_180 = &this->field_generators_;
    iVar13 = FieldGeneratorMap::CalculateHasBits(local_180);
    uVar15 = 1;
    if (0x1f < (long)iVar13 + 0x1fU) {
      uVar15 = (long)iVar13 + 0x1fU >> 5;
    }
    puVar4 = (this->oneof_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar21 = (this->oneof_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar4;
        puVar21 = puVar21 + 1) {
      OneofGenerator::SetOneofIndexBase
                ((puVar21->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                 ._M_head_impl,(int)uVar15);
    }
    FieldGeneratorMap::SetOneofIndexBase(local_180,(int)uVar15);
    pEVar5 = (ExtensionRange *)(local_f0 + 8);
    local_f8 = (undefined1  [8])pEVar5;
    local_f0._0_8_ =
         FastUInt64ToBufferLeft
                   (((long)(this->oneof_generators_).
                           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->oneof_generators_).
                           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) + uVar15,(char *)pEVar5);
    local_f0._0_8_ = local_f0._0_8_ + -(long)pEVar5;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,local_f8,(char *)(local_f0._0_8_ + (long)local_f8));
    io::Printer::Print<char[10],std::__cxx11::string,char[19],std::__cxx11::string>
              (printer,
               "\ntypedef struct $classname$__storage_ {\n  uint32_t _has_storage_[$sizeof_has_storage$];\n"
               ,(char (*) [10])0x3e9312,args_1,(char (*) [19])"sizeof_has_storage",&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    io::Printer::Indent(printer);
    if (0 < *(int *)(this->descriptor_ + 4)) {
      lVar26 = 0;
      do {
        pFVar14 = FieldGeneratorMap::get
                            (local_180,*(FieldDescriptor **)((long)local_188 + lVar26 * 8));
        (*pFVar14->_vptr_FieldGenerator[2])(pFVar14,printer);
        lVar26 = lVar26 + 1;
      } while (lVar26 < *(int *)(this->descriptor_ + 4));
    }
    io::Printer::Outdent(printer);
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"} $classname$__storage_;\n\n",(char (*) [10])0x3e9312,args_1);
    io::Printer::Print<>
              (printer,
               "// This method is threadsafe because it is initially called\n// in +initialize for each subclass.\n+ (GPBDescriptor *)descriptor {\n  static GPBDescriptor *descriptor = nil;\n  if (!descriptor) {\n"
              );
    TextFormatDecodeData::TextFormatDecodeData(&local_90);
    iVar13 = *(int *)(this->descriptor_ + 4);
    include_default = FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault(local_180);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    pcVar19 = "GPBMessageFieldDescription";
    if (include_default) {
      pcVar19 = "GPBMessageFieldDescriptionWithDefault";
    }
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar19);
    if (0 < iVar13) {
      io::Printer::Indent(printer);
      io::Printer::Indent(printer);
      io::Printer::Print<char[23],std::__cxx11::string>
                (printer,"static $field_description_type$ fields[] = {\n",
                 (char (*) [23])"field_description_type",&local_70);
      io::Printer::Indent(printer);
      local_fc = iVar13;
      local_78 = args_1;
      if (0 < *(int *)(this->descriptor_ + 4)) {
        lVar26 = 0;
        do {
          pFVar14 = FieldGeneratorMap::get(local_180,local_158[lVar26]);
          FieldGenerator::GenerateFieldDescription(pFVar14,printer,include_default);
          bVar12 = FieldGenerator::needs_textformat_name_support(pFVar14);
          if (bVar12) {
            key = *(int32_t *)(local_158[lVar26] + 4);
            FieldGenerator::variable_abi_cxx11_((string *)local_f8,pFVar14,"name");
            FieldGenerator::variable_abi_cxx11_(&local_1b8,pFVar14,"raw_field_name");
            TextFormatDecodeData::AddString(&local_90,key,(string *)local_f8,&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p);
            }
            if (local_f8 != (undefined1  [8])(local_f0 + 8)) {
              operator_delete((void *)local_f8);
            }
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 < *(int *)(this->descriptor_ + 4));
      }
      io::Printer::Outdent(printer);
      iVar13 = local_fc;
      io::Printer::Print<>(printer,"};\n");
      io::Printer::Outdent(printer);
      io::Printer::Outdent(printer);
    }
    local_f0._16_8_ = local_f0;
    local_f0._0_8_ = local_f0._0_8_ & 0xffffffff00000000;
    local_f0._8_8_ = 0;
    local_d0 = 0;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_d8 = (_Base_ptr)local_f0._16_8_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"classname","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,&local_1b8);
    std::__cxx11::string::_M_assign((string *)pmVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"rootclassname","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,&local_1b8);
    std::__cxx11::string::_M_assign((string *)pmVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    pcVar19 = "NULL";
    if (0 < iVar13) {
      pcVar19 = "fields";
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"fields","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,&local_1b8);
    std::__cxx11::string::_M_replace
              ((ulong)pmVar16,0,(char *)pmVar16->_M_string_length,(ulong)pcVar19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if (iVar13 < 1) {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"fields_count","");
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_f8,&local_1b8);
      std::__cxx11::string::_M_replace((ulong)pmVar16,0,(char *)pmVar16->_M_string_length,0x3dfd5d);
      pbVar9 = &local_1b8;
      local_150._M_dataplus._M_p = local_1b8._M_dataplus._M_p;
    }
    else {
      std::operator+(&local_150,"(uint32_t)(sizeof(fields) / sizeof(",&local_70);
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_150);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      puVar20 = (ulong *)(plVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_1b8.field_2._M_allocated_capacity = *puVar20;
        local_1b8.field_2._8_8_ = plVar17[3];
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *puVar20;
        local_1b8._M_dataplus._M_p = (pointer)*plVar17;
      }
      local_1b8._M_string_length = plVar17[1];
      *plVar17 = (long)puVar20;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"fields_count","");
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_f8,&local_120);
      std::__cxx11::string::operator=((string *)pmVar16,(string *)&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      pbVar9 = &local_150;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &pbVar9->field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"GPBDescriptorInitializationFlag_UsesClassRefs","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"GPBDescriptorInitializationFlag_Proto3OptionalKnown","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if (include_default) {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,"GPBDescriptorInitializationFlag_FieldsWithDefault","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                 &local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
    }
    if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x48) == '\x01') {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,"GPBDescriptorInitializationFlag_WireFormat","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                 &local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
    }
    BuildFlagsString(&local_1b8,FLAGTYPE_DESCRIPTOR_INITIALIZATION,&local_c8);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"init_flags","");
    pmVar16 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,&local_150);
    std::__cxx11::string::operator=((string *)pmVar16,(string *)&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_f8,
                       "    GPBDescriptor *localDescriptor =\n        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n                                     rootClass:[$rootclassname$ class]\n                                          file:$rootclassname$_FileDescriptor()\n                                        fields:$fields$\n                                    fieldCount:$fields_count$\n                                   storageSize:sizeof($classname$__storage_)\n                                         flags:$init_flags$];\n"
                      );
    pDVar18 = extraout_RDX;
    if ((this->oneof_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->oneof_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      io::Printer::Print<>(printer,"    static const char *oneofs[] = {\n");
      puVar21 = (this->oneof_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->oneof_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar21 != puVar4) {
        do {
          OneofGenerator::DescriptorName_abi_cxx11_
                    (&local_1b8,
                     (puVar21->_M_t).
                     super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                     ._M_head_impl);
          io::Printer::Print<char[5],std::__cxx11::string>
                    (printer,"      \"$name$\",\n",(char (*) [5])0x3ea8a1,&local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p);
          }
          puVar21 = puVar21 + 1;
        } while (puVar21 != puVar4);
        puVar21 = (this->oneof_generators_).
                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      OneofGenerator::HasIndexAsString_abi_cxx11_
                (&local_1b8,
                 (puVar21->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                 ._M_head_impl);
      io::Printer::Print<char[16],std::__cxx11::string>
                (printer,
                 "    };\n    [localDescriptor setupOneofs:oneofs\n                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n                   firstHasIndex:$first_has_index$];\n"
                 ,(char (*) [16])"first_has_index",&local_1b8);
      pDVar18 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
        pDVar18 = extraout_RDX_01;
      }
    }
    if (local_90.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_90.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      TextFormatDecodeData::Data_abi_cxx11_(&local_1b8,&local_90);
      io::Printer::Print<>
                (printer,
                 "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n    static const char *extraTextFormatInfo ="
                );
      if (local_1b8._M_string_length != 0) {
        uVar15 = 0;
        do {
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_1b8);
          CEscape(&local_120,&local_b0);
          EscapeTrigraphs(&local_150,&local_120);
          io::Printer::Print<char[5],std::__cxx11::string>
                    (printer,"\n        \"$data$\"",(char (*) [5])0x3e752c,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          uVar15 = uVar15 + 0x28;
        } while (uVar15 < local_1b8._M_string_length);
      }
      io::Printer::Print<>
                (printer,
                 ";\n    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
                );
      pDVar18 = extraout_RDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
        pDVar18 = extraout_RDX_03;
      }
    }
    if (local_178.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_178.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      io::Printer::Print<>(printer,"    static const GPBExtensionRange ranges[] = {\n");
      if (local_178.
          super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_178.
          super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar15 = 0;
        do {
          paVar2 = &local_1b8.field_2;
          local_1b8._M_dataplus._M_p = (pointer)paVar2;
          pcVar19 = FastInt32ToBufferLeft
                              (local_178.
                               super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar15]->start,
                               paVar2->_M_local_buf);
          local_1b8._M_string_length = (long)pcVar19 - (long)paVar2;
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,local_1b8._M_dataplus._M_p,
                     local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
          paVar2 = &local_150.field_2;
          local_150._M_dataplus._M_p = (pointer)paVar2;
          pcVar19 = FastInt32ToBufferLeft
                              (local_178.
                               super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar15]->end,
                               paVar2->_M_local_buf);
          local_150._M_string_length = (long)pcVar19 - (long)paVar2;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,local_150._M_dataplus._M_p,
                     local_150._M_dataplus._M_p + local_150._M_string_length);
          io::Printer::Print<char[6],std::__cxx11::string,char[4],std::__cxx11::string>
                    (printer,"      { .start = $start$, .end = $end$ },\n",(char (*) [6])0x3ebfa3,
                     &local_120,(char (*) [4])0x3ebfb4,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)local_178.
                                        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_178.
                                        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      io::Printer::Print<>
                (printer,
                 "    };\n    [localDescriptor setupExtensionRanges:ranges\n                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n"
                );
      pDVar18 = extraout_RDX_04;
    }
    descriptor = this->descriptor_;
    if (*(objectivec **)(descriptor + 0x18) != (objectivec *)0x0) {
      ClassName_abi_cxx11_(&local_1b8,*(objectivec **)(descriptor + 0x18),pDVar18);
      ObjCClass(&local_150,&local_1b8);
      io::Printer::Print<char[17],std::__cxx11::string>
                (printer,"    [localDescriptor setupContainingMessageClass:$parent_class_ref$];\n",
                 (char (*) [17])"parent_class_ref",&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      descriptor = this->descriptor_;
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_allocated_capacity =
         local_1b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    ClassName(&local_50,descriptor,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_1b8._M_string_length != 0) {
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,"    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
                 (char (*) [7])0x3ea6f2,&local_1b8);
    }
    io::Printer::Print<>
              (printer,
               "    #if defined(DEBUG) && DEBUG\n      NSAssert(descriptor == nil, @\"Startup recursed!\");\n    #endif  // DEBUG\n    descriptor = localDescriptor;\n  }\n  return descriptor;\n}\n\n@end\n\n"
              );
    if ((this->deprecated_attribute_)._M_string_length != 0) {
      io::Printer::Print<>(printer,"#pragma clang diagnostic pop\n\n");
    }
    pDVar18 = this->descriptor_;
    if (0 < *(int *)(pDVar18 + 4)) {
      lVar26 = 0;
      lVar28 = 0;
      do {
        pFVar14 = FieldGeneratorMap::get
                            (local_180,(FieldDescriptor *)(*(long *)(pDVar18 + 0x28) + lVar26));
        (*pFVar14->_vptr_FieldGenerator[6])(pFVar14,printer);
        lVar28 = lVar28 + 1;
        pDVar18 = this->descriptor_;
        lVar26 = lVar26 + 0x48;
      } while (lVar28 < *(int *)(pDVar18 + 4));
    }
    puVar4 = (this->oneof_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar21 = (this->oneof_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar4;
        puVar21 = puVar21 + 1) {
      OneofGenerator::GenerateClearFunctionImplementation
                ((puVar21->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                 ._M_head_impl,printer);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    TextFormatDecodeData::~TextFormatDecodeData(&local_90);
    if (local_178.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.
                      super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    operator_delete__(local_188);
    operator_delete__(local_158);
  }
  puVar7 = (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar22 = (this->enum_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar22 != puVar7; puVar22 = puVar22 + 1
      ) {
    EnumGenerator::GenerateSource
              ((puVar22->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::EnumGenerator_*,_false>
               ._M_head_impl,printer);
  }
  puVar8 = (this->nested_message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar23 = (this->nested_message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar23 != puVar8; puVar23 = puVar23 + 1
      ) {
    GenerateSource((puVar23->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
                   ._M_head_impl,printer);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSource(io::Printer* printer) {
  if (!IsMapEntryMessage(descriptor_)) {
    printer->Print(
        "#pragma mark - $classname$\n"
        "\n",
        "classname", class_name_);

    if (!deprecated_attribute_.empty()) {
      // No warnings when compiling the impl of this deprecated class.
      printer->Print(
          "#pragma clang diagnostic push\n"
          "#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n"
          "\n");
    }

    printer->Print("@implementation $classname$\n\n",
                   "classname", class_name_);

    for (const auto& generator : oneof_generators_) {
      generator->GeneratePropertyImplementation(printer);
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GeneratePropertyImplementation(printer);
    }

    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    std::unique_ptr<const FieldDescriptor*[]> size_order_fields(
        SortFieldsByStorageSize(descriptor_));

    std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
    sorted_extensions.reserve(descriptor_->extension_range_count());
    for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
      sorted_extensions.push_back(descriptor_->extension_range(i));
    }

    std::sort(sorted_extensions.begin(), sorted_extensions.end(),
         ExtensionRangeOrdering());

    // Assign has bits:
    // 1. FieldGeneratorMap::CalculateHasBits() loops through the fields seeing
    //    who needs has bits and assigning them.
    // 2. FieldGenerator::SetOneofIndexBase() overrides has_bit with a negative
    //    index that groups all the elements in the oneof.
    size_t num_has_bits = field_generators_.CalculateHasBits();
    size_t sizeof_has_storage = (num_has_bits + 31) / 32;
    if (sizeof_has_storage == 0) {
      // In the case where no field needs has bits, don't let the _has_storage_
      // end up as zero length (zero length arrays are sort of a grey area
      // since it has to be at the start of the struct). This also ensures a
      // field with only oneofs keeps the required negative indices they need.
      sizeof_has_storage = 1;
    }
    // Tell all the fields the oneof base.
    for (const auto& generator : oneof_generators_) {
      generator->SetOneofIndexBase(sizeof_has_storage);
    }
    field_generators_.SetOneofIndexBase(sizeof_has_storage);
    // sizeof_has_storage needs enough bits for the single fields that aren't in
    // any oneof, and then one int32 for each oneof (to store the field number).
    sizeof_has_storage += oneof_generators_.size();

    printer->Print(
        "\n"
        "typedef struct $classname$__storage_ {\n"
        "  uint32_t _has_storage_[$sizeof_has_storage$];\n",
        "classname", class_name_,
        "sizeof_has_storage", StrCat(sizeof_has_storage));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(size_order_fields[i])
          .GenerateFieldStorageDeclaration(printer);
    }
    printer->Outdent();

    printer->Print("} $classname$__storage_;\n\n", "classname", class_name_);


    printer->Print(
        "// This method is threadsafe because it is initially called\n"
        "// in +initialize for each subclass.\n"
        "+ (GPBDescriptor *)descriptor {\n"
        "  static GPBDescriptor *descriptor = nil;\n"
        "  if (!descriptor) {\n");

    TextFormatDecodeData text_format_decode_data;
    bool has_fields = descriptor_->field_count() > 0;
    bool need_defaults = field_generators_.DoesAnyFieldHaveNonZeroDefault();
    std::string field_description_type;
    if (need_defaults) {
      field_description_type = "GPBMessageFieldDescriptionWithDefault";
    } else {
      field_description_type = "GPBMessageFieldDescription";
    }
    if (has_fields) {
      printer->Indent();
      printer->Indent();
      printer->Print(
          "static $field_description_type$ fields[] = {\n",
          "field_description_type", field_description_type);
      printer->Indent();
      for (int i = 0; i < descriptor_->field_count(); ++i) {
        const FieldGenerator& field_generator =
            field_generators_.get(sorted_fields[i]);
        field_generator.GenerateFieldDescription(printer, need_defaults);
        if (field_generator.needs_textformat_name_support()) {
          text_format_decode_data.AddString(sorted_fields[i]->number(),
                                            field_generator.generated_objc_name(),
                                            field_generator.raw_field_name());
        }
      }
      printer->Outdent();
      printer->Print(
          "};\n");
      printer->Outdent();
      printer->Outdent();
    }

    std::map<std::string, std::string> vars;
    vars["classname"] = class_name_;
    vars["rootclassname"] = root_classname_;
    vars["fields"] = has_fields ? "fields" : "NULL";
    if (has_fields) {
      vars["fields_count"] =
          "(uint32_t)(sizeof(fields) / sizeof(" + field_description_type + "))";
    } else {
      vars["fields_count"] = "0";
    }

    std::vector<std::string> init_flags;
    init_flags.push_back("GPBDescriptorInitializationFlag_UsesClassRefs");
    init_flags.push_back("GPBDescriptorInitializationFlag_Proto3OptionalKnown");
    if (need_defaults) {
      init_flags.push_back("GPBDescriptorInitializationFlag_FieldsWithDefault");
    }
    if (descriptor_->options().message_set_wire_format()) {
      init_flags.push_back("GPBDescriptorInitializationFlag_WireFormat");
    }
    vars["init_flags"] = BuildFlagsString(FLAGTYPE_DESCRIPTOR_INITIALIZATION,
                                          init_flags);

    printer->Print(
        vars,
        "    GPBDescriptor *localDescriptor =\n"
        "        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n"
        "                                     rootClass:[$rootclassname$ class]\n"
        "                                          file:$rootclassname$_FileDescriptor()\n"
        "                                        fields:$fields$\n"
        "                                    fieldCount:$fields_count$\n"
        "                                   storageSize:sizeof($classname$__storage_)\n"
        "                                         flags:$init_flags$];\n");
    if (!oneof_generators_.empty()) {
      printer->Print(
          "    static const char *oneofs[] = {\n");
      for (const auto& generator : oneof_generators_) {
        printer->Print("      \"$name$\",\n", "name",
                       generator->DescriptorName());
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupOneofs:oneofs\n"
          "                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n"
          "                   firstHasIndex:$first_has_index$];\n",
          "first_has_index", oneof_generators_[0]->HasIndexAsString());
    }
    if (text_format_decode_data.num_entries() != 0) {
      const std::string text_format_data_str(text_format_decode_data.Data());
      printer->Print(
          "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
          "    static const char *extraTextFormatInfo =");
      static const int kBytesPerLine = 40;  // allow for escaping
      for (int i = 0; i < text_format_data_str.size(); i += kBytesPerLine) {
        printer->Print(
            "\n        \"$data$\"",
            "data", EscapeTrigraphs(
                CEscape(text_format_data_str.substr(i, kBytesPerLine))));
      }
      printer->Print(
          ";\n"
          "    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n"
          "#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n");
    }
    if (!sorted_extensions.empty()) {
      printer->Print(
          "    static const GPBExtensionRange ranges[] = {\n");
      for (int i = 0; i < sorted_extensions.size(); i++) {
        printer->Print("      { .start = $start$, .end = $end$ },\n",
                       "start", StrCat(sorted_extensions[i]->start),
                       "end", StrCat(sorted_extensions[i]->end));
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupExtensionRanges:ranges\n"
          "                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n");
    }
    if (descriptor_->containing_type() != NULL) {
      std::string containing_class = ClassName(descriptor_->containing_type());
      std::string parent_class_ref = ObjCClass(containing_class);
      printer->Print(
          "    [localDescriptor setupContainingMessageClass:$parent_class_ref$];\n",
          "parent_class_ref", parent_class_ref);
    }
    std::string suffix_added;
    ClassName(descriptor_, &suffix_added);
    if (!suffix_added.empty()) {
      printer->Print(
          "    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
          "suffix", suffix_added);
    }
    printer->Print(
        "    #if defined(DEBUG) && DEBUG\n"
        "      NSAssert(descriptor == nil, @\"Startup recursed!\");\n"
        "    #endif  // DEBUG\n"
        "    descriptor = localDescriptor;\n"
        "  }\n"
        "  return descriptor;\n"
        "}\n\n"
        "@end\n\n");

    if (!deprecated_attribute_.empty()) {
      printer->Print(
          "#pragma clang diagnostic pop\n"
          "\n");
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateCFunctionImplementations(printer);
    }

    for (const auto& generator : oneof_generators_) {
      generator->GenerateClearFunctionImplementation(printer);
    }
  }

  for (const auto& generator : enum_generators_) {
    generator->GenerateSource(printer);
  }

  for (const auto& generator : nested_message_generators_) {
    generator->GenerateSource(printer);
  }
}